

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

bool efsw::FileInfo::exists(string *filePath)

{
  bool bVar1;
  FileInfo fi;
  FileInfo local_50;
  
  FileInfo(&local_50,filePath);
  bVar1 = exists(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Filepath._M_dataplus._M_p != &local_50.Filepath.field_2) {
    operator_delete(local_50.Filepath._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool FileInfo::exists( const std::string& filePath ) {
	FileInfo fi( filePath );
	return fi.exists();
}